

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

char * subclassname(Fl_Type *l)

{
  uchar uVar1;
  int iVar2;
  char *pcVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *c;
  Fl_Widget_Type *p;
  Fl_Type *l_local;
  
  iVar2 = (*l->_vptr_Fl_Type[0x17])();
  if (iVar2 != 0) {
    pcVar3 = Fl_Widget_Type::subclass((Fl_Widget_Type *)l);
    if (pcVar3 != (char *)0x0) {
      return pcVar3;
    }
    iVar2 = (*l->_vptr_Fl_Type[0x26])();
    if (iVar2 != 0) {
      l_local = (Fl_Type *)anon_var_dwarf_6438;
      return (char *)l_local;
    }
    uVar1 = Fl_Widget::type((Fl_Widget *)l[1].prev);
    if (uVar1 == 0xf1) {
      l_local = (Fl_Type *)anon_var_dwarf_1288b;
      return (char *)l_local;
    }
    iVar2 = (*l->_vptr_Fl_Type[5])();
    iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"Fl_Input");
    if (iVar2 == 0) {
      uVar1 = Fl_Widget::type((Fl_Widget *)l[1].prev);
      if (uVar1 == '\x01') {
        l_local = (Fl_Type *)anon_var_dwarf_128ab;
        return (char *)l_local;
      }
      uVar1 = Fl_Widget::type((Fl_Widget *)l[1].prev);
      if (uVar1 == '\x02') {
        l_local = (Fl_Type *)anon_var_dwarf_128c1;
        return (char *)l_local;
      }
    }
  }
  iVar2 = (*l->_vptr_Fl_Type[5])();
  return (char *)CONCAT44(extraout_var_00,iVar2);
}

Assistant:

const char* subclassname(Fl_Type* l) {
  if (l->is_widget()) {
    Fl_Widget_Type* p = (Fl_Widget_Type*)l;
    const char* c = p->subclass();
    if (c) return c;
    if (l->is_class()) return "Fl_Group";
    if (p->o->type() == FL_WINDOW+1) return "Fl_Double_Window";
    if (strcmp(p->type_name(), "Fl_Input") == 0) {
      if (p->o->type() == FL_FLOAT_INPUT) return "Fl_Float_Input";
      if (p->o->type() == FL_INT_INPUT) return "Fl_Int_Input";
    }
  }
  return l->type_name();
}